

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GetterXsYs<int> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<int> *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  uint uVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar25;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  pIVar13 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar3 = pGVar7->Count;
  lVar16 = (long)(((pGVar7->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar7->Stride;
  iVar3 = *(int *)((long)pGVar7->Ys + lVar16);
  dVar18 = log10((double)*(int *)((long)pGVar7->Xs + lVar16) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar9 = pIVar13->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar8->YAxis;
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar10->Count;
  IVar1 = pIVar13->PixelRange[iVar4].Min;
  fVar21 = (float)(pIVar13->Mx *
                   (((double)(float)(dVar18 / pIVar13->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar1.x);
  fVar25 = (float)(pIVar13->My[iVar4] * ((double)iVar3 - pIVar9->YAxis[iVar4].Range.Min) +
                  (double)IVar1.y);
  dVar2 = pGVar10->YRef;
  dVar19 = log10((double)*(int *)((long)pGVar10->Xs +
                                 (long)(((prim + 1 + pGVar10->Offset) % iVar5 + iVar5) % iVar5) *
                                 (long)pGVar10->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar14->CurrentPlot;
  dVar18 = (pIVar9->XAxis).Range.Min;
  iVar3 = pTVar8->YAxis;
  IVar1 = pIVar14->PixelRange[iVar3].Min;
  fVar17 = (float)(pIVar14->Mx *
                   (((double)(float)(dVar19 / pIVar14->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar18) + dVar18) - dVar18) + (double)IVar1.x);
  fVar20 = (float)(pIVar14->My[iVar3] * (dVar2 - pIVar9->YAxis[iVar3].Range.Min) + (double)IVar1.y);
  fVar26 = (this->P12).x;
  fVar27 = (this->P12).y;
  fVar29 = (this->P11).x;
  fVar30 = (this->P11).y;
  fVar22 = fVar25 * fVar29 - fVar21 * fVar30;
  fVar31 = fVar26 * fVar20 - fVar27 * fVar17;
  fVar29 = fVar29 - fVar21;
  fVar26 = fVar26 - fVar17;
  fVar28 = fVar27 - fVar20;
  fVar32 = fVar28 * fVar29 - (fVar30 - fVar25) * fVar26;
  auVar23._0_4_ = fVar22 * fVar26 - fVar31 * fVar29;
  auVar23._4_4_ = fVar22 * fVar28 - fVar31 * (fVar30 - fVar25);
  auVar23._8_4_ = fVar25 * 0.0 - fVar27 * 0.0;
  auVar23._12_4_ = fVar25 * 0.0 - fVar27 * 0.0;
  auVar24._4_4_ = fVar32;
  auVar24._0_4_ = fVar32;
  auVar24._8_4_ = fVar28;
  auVar24._12_4_ = fVar28;
  auVar24 = divps(auVar23,auVar24);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11->col = this->Col;
  pIVar11[1].pos.x = fVar21;
  pIVar11[1].pos.y = fVar25;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[1].col = this->Col;
  pIVar11[2].pos = auVar24._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[2].col = this->Col;
  pIVar11[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[3].col = this->Col;
  pIVar11[4].uv.x = fVar17;
  pIVar11[4].uv.y = fVar20;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar11 = DrawList->_VtxWritePtr;
  pIVar11[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar11 + 5;
  uVar6 = DrawList->_VtxCurrentIdx;
  puVar12 = DrawList->_IdxWritePtr;
  *puVar12 = uVar6;
  uVar15 = -(uint)(fVar25 < fVar20 && fVar27 < fVar30 || fVar20 < fVar25 && fVar30 < fVar27) & 1;
  puVar12[1] = uVar6 + uVar15 + 1;
  puVar12[2] = DrawList->_VtxCurrentIdx + 3;
  puVar12[3] = DrawList->_VtxCurrentIdx + 1;
  puVar12[4] = (uVar15 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar12[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar12 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar21;
  (this->P11).y = fVar25;
  (this->P12).x = fVar17;
  (this->P12).y = fVar20;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }